

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrunsym.cpp
# Opt level: O0

void __thiscall CVmRuntimeSymbols::~CVmRuntimeSymbols(CVmRuntimeSymbols *this)

{
  undefined8 *puVar1;
  undefined8 *in_RDI;
  vm_runtime_sym *nxt;
  vm_runtime_sym *sym;
  undefined8 local_10;
  
  local_10 = (undefined8 *)*in_RDI;
  while (local_10 != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)*local_10;
    free(local_10);
    local_10 = puVar1;
  }
  return;
}

Assistant:

CVmRuntimeSymbols::~CVmRuntimeSymbols()
{
    vm_runtime_sym *sym;
    vm_runtime_sym *nxt;
    
    /* delete each symbol */
    for (sym = head_ ; sym != 0 ; sym = nxt)
    {
        /* 
         *   remember the next one, since we're deleting our link pointer
         *   along with the structure 
         */
        nxt = sym->nxt;

        /* delete it */
        t3free(sym);
    }
}